

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::addNewClause(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  Clause *in_RSI;
  Clause *in_RDI;
  Clause *in_stack_00000038;
  SaturationAlgorithm *in_stack_00000040;
  
  bVar1 = Shell::Options::randomTraversals(Lib::env);
  if (bVar1) {
    Shell::Shuffling::shuffle(in_RSI);
  }
  Kernel::Clause::incRefCnt(in_RSI);
  onNewClause(in_stack_00000040,in_stack_00000038);
  Kernel::RCClauseStack::push((RCClauseStack *)in_RSI,in_RDI);
  Kernel::Clause::decRefCnt((Clause *)0xad036a);
  return;
}

Assistant:

void SaturationAlgorithm::addNewClause(Clause* cl)
{
  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Shuffling::shuffle(cl);
  }

  // we increase the reference counter here so that the clause wouldn't
  // get destroyed during handling in the onNewClause handler
  //(there the control flow goes out of the SaturationAlgorithm class,
  // so we'd better not assume on what's happening out there)
  cl->incRefCnt();
  onNewClause(cl);
  _newClauses.push(cl);
  // we can decrease the counter here -- it won't get deleted because
  // the _newClauses RC stack already took over the clause
  cl->decRefCnt();
}